

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_cell_has_face(REF_GRID ref_grid,REF_INT *face_nodes,REF_BOOL *has_face)

{
  uint uVar1;
  REF_INT local_3c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT group;
  REF_CELL ref_cell;
  REF_BOOL *has_face_local;
  REF_INT *face_nodes_local;
  REF_GRID ref_grid_local;
  
  *has_face = 0;
  cell1 = 8;
  _cell0 = ref_grid->cell[8];
  ref_cell = (REF_CELL)has_face;
  has_face_local = face_nodes;
  face_nodes_local = (REF_INT *)ref_grid;
  while( true ) {
    if (0xf < cell1) {
      return 0;
    }
    uVar1 = ref_cell_with_face(_cell0,has_face_local,&ref_private_macro_code_rss,&local_3c);
    if (uVar1 != 0) break;
    ref_cell->type = (uint)(ref_private_macro_code_rss != -1);
    if (ref_cell->type != REF_CELL_EDG) {
      return 0;
    }
    cell1 = cell1 + 1;
    _cell0 = *(REF_CELL *)(face_nodes_local + (long)cell1 * 2 + 4);
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x151,
         "ref_grid_cell_has_face",(ulong)uVar1,"face search failed");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_cell_has_face(REF_GRID ref_grid,
                                          REF_INT *face_nodes,
                                          REF_BOOL *has_face) {
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT cell0, cell1;

  *has_face = REF_FALSE;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1),
        "face search failed");
    *has_face = (REF_EMPTY != cell0);
    if (*has_face) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}